

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::IsFullPolygonIntersection(Impl *this,S2ShapeIndex *a,S2ShapeIndex *b)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = GetFaceMask(a);
  bVar2 = GetFaceMask(b);
  if ((bVar2 & bVar1) == 0x3f) {
    dVar4 = S2::GetArea(a);
    dVar5 = S2::GetArea(b);
    dVar6 = dVar4 + dVar5 + -12.566370614359172;
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    if (dVar4 <= dVar5) {
      dVar5 = dVar4;
    }
    bVar3 = 12.566370614359172 - dVar5 < dVar6;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonIntersection(
    const S2ShapeIndex& a, const S2ShapeIndex& b) const {
  // See comments in IsFullPolygonResult().  By far the most common case is
  // that the result is empty.

  // The result can be full only if each of the two input geometries
  // intersects all six faces of the S2 cube.  This test is fast.
  if ((GetFaceMask(a) & GetFaceMask(b)) != kAllFacesMask) return false;

  // The intersection area satisfies:
  //
  //   max(0, A + B - 4*Pi) <= Intersection(A, B) <= min(A, B)
  //
  // where A, B can refer to a polygon or its area.  We then choose the result
  // that assumes the smallest amount of error.
  double a_area = S2::GetArea(a), b_area = S2::GetArea(b);
  double min_area = max(0.0, a_area + b_area - 4 * M_PI);
  double max_area = min(a_area, b_area);
  return min_area > 4 * M_PI - max_area;
}